

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GCStress.cpp
# Opt level: O2

void SimpleRecyclerTest(void)

{
  BackgroundPageQueue *this;
  HeapAllocator *alloc;
  Recycler *this_00;
  int iVar1;
  RecyclerTestObject **location;
  long lVar2;
  bool bVar3;
  Location LVar4;
  undefined1 local_3d8 [8];
  RecyclerTestObject *stackRoots [50];
  undefined1 local_240 [8];
  IdleDecommitPageAllocator pageAllocator;
  BackgroundPageQueue backgroundPageQueue;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  BuildObjectCreationTable();
  BuildOperationTable();
  this = (BackgroundPageQueue *)(pageAllocator.cs.super_CCLock.mutexPtr + 0x38);
  Memory::
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  ::BackgroundPageQueue::BackgroundPageQueue(this);
  Memory::IdleDecommitPageAllocator::IdleDecommitPageAllocator
            ((IdleDecommitPageAllocator *)local_240,(AllocationPolicyManager *)0x0,
             PageAllocatorType_Thread,(ConfigFlagsTable *)Js::Configuration::Global,0,0x400,false,
             this,0x20,false);
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)&backgroundPageQueue.field_0x4c,
             ExceptionType_DisableCheck);
  local_3d8 = (undefined1  [8])&Memory::Recycler::typeinfo;
  stackRoots[0] = (RecyclerTestObject *)0x0;
  stackRoots[1] = (RecyclerTestObject *)0xffffffffffffffff;
  stackRoots[2] = (RecyclerTestObject *)anon_var_dwarf_3693;
  stackRoots[3]._0_4_ = 0x114;
  alloc = Memory::HeapAllocator::TrackAllocInfo
                    (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_3d8);
  this_00 = (Recycler *)new<Memory::HeapAllocator>(0x166e0,alloc,0x1e2ca2);
  Memory::Recycler::Recycler
            (this_00,(AllocationPolicyManager *)0x0,(IdleDecommitPageAllocator *)local_240,
             Js::Throw::OutOfMemory,(ConfigFlagsTable *)Js::Configuration::Global,
             (RecyclerTelemetryHostInterface *)0x0);
  recyclerInstance = this_00;
  Memory::Recycler::Initialize(this_00,false,(ThreadService *)0x0,false,PageHeapModeOff,false,false)
  ;
  PAL_wprintf(L"Recycler created, initializing heap...\n");
  for (lVar2 = 0; lVar2 != 400; lVar2 = lVar2 + 8) {
    location = (RecyclerTestObject **)((long)stackRoots + lVar2 + -8);
    *location = (RecyclerTestObject *)0x0;
    LVar4 = Location::Scanned(location);
    WeightedTable<Location>::AddWeightedEntry(&roots,LVar4,1);
  }
  for (lVar2 = 0; lVar2 != 400; lVar2 = lVar2 + 8) {
    *(undefined8 *)((long)globalRoots + lVar2) = 0;
    LVar4 = Location::Rooted((RecyclerTestObject **)((long)globalRoots + lVar2));
    WeightedTable<Location>::AddWeightedEntry(&roots,LVar4,1);
  }
  if (implicitRootsMode == true) {
    for (lVar2 = 0; lVar2 != 400; lVar2 = lVar2 + 8) {
      *(undefined8 *)((long)implicitRoots + lVar2) = 0;
      LVar4 = Location::ImplicitRoot((RecyclerTestObject **)((long)implicitRoots + lVar2));
      WeightedTable<Location>::AddWeightedEntry(&roots,LVar4,1);
    }
  }
  iVar1 = 10000;
  while (bVar3 = iVar1 != 0, iVar1 = iVar1 + -1, bVar3) {
    InsertObject();
  }
  PAL_wprintf(L"Initialization complete\n");
  WalkHeap();
  iVar1 = 0;
  do {
    while (iVar1 == 100000) {
      WalkHeap();
      Memory::Recycler::FinishDisposeObjectsNow<(Memory::CollectionFlags)32768>(recyclerInstance);
      iVar1 = 0;
    }
    DoHeapOperation();
    iVar1 = iVar1 + 1;
  } while( true );
}

Assistant:

void SimpleRecyclerTest()
{
    // Initialize the probability tables for object creation and heap operations.
    BuildObjectCreationTable();
    BuildOperationTable();

    // Construct Recycler instance and use it
#if ENABLE_BACKGROUND_PAGE_FREEING
    PageAllocator::BackgroundPageQueue backgroundPageQueue;
#endif
    IdleDecommitPageAllocator pageAllocator(nullptr, 
        PageAllocatorType::PageAllocatorType_Thread,
        Js::Configuration::Global.flags,
        0 /* maxFreePageCount */, PageAllocator::DefaultMaxFreePageCount /* maxIdleFreePageCount */,
        false /* zero pages */
#if ENABLE_BACKGROUND_PAGE_FREEING
        , &backgroundPageQueue
#endif
        );

    try
    {
#ifdef EXCEPTION_CHECK
        // REVIEW: Do we need a stack probe here? We don't care about OOM's since we deal with that below
        AUTO_NESTED_HANDLED_EXCEPTION_TYPE(ExceptionType_DisableCheck);
#endif

        recyclerInstance = HeapNewZ(Recycler, nullptr, &pageAllocator, Js::Throw::OutOfMemory, Js::Configuration::Global.flags, nullptr);

        recyclerInstance->Initialize(false /* forceInThread */, nullptr /* threadService */);

#if FALSE
        // TODO: Support EnableImplicitRoots call on Recycler (or similar, e.g. constructor param)
        // Until then, implicitRootsMode support doesn't actually work.
        if (implicitRootsMode)
        {
            recycler->EnableImplicitRoots();
        }
#endif

        wprintf(_u("Recycler created, initializing heap...\n"));
        
        // Initialize stack roots and add to our roots table        
        RecyclerTestObject * stackRoots[stackRootCount];
        for (unsigned int i = 0; i < stackRootCount; i++)
        {
            stackRoots[i] = nullptr;
            roots.AddWeightedEntry(Location::Scanned(&stackRoots[i]), 1);
        }

        // Initialize global roots and add to our roots table        
        for (unsigned int i = 0; i < globalRootCount; i++)
        {
            globalRoots[i] = nullptr;
            roots.AddWeightedEntry(Location::Rooted(&globalRoots[i]), 1);
        }

        // MemProtect only:
        // Initialize implicit roots and add to our roots table        
        if (implicitRootsMode)
        {
            for (unsigned int i = 0; i < implicitRootCount; i++)
            {
                implicitRoots[i] = nullptr;
                roots.AddWeightedEntry(Location::ImplicitRoot(&implicitRoots[i]), 1);
            }
        }
        
        // Initialize GC heap randomly
        for (unsigned int i = 0; i < initializeCount; i++)
        {
            InsertObject();
        }

        wprintf(_u("Initialization complete\n"));

        // Do an initial walk
        WalkHeap();

        // Loop, continually doing heap operations, and periodically doing a full heap walk
        while (true)
        {
            for (unsigned int i = 0; i < operationsPerHeapWalk; i++)
            {
                DoHeapOperation();
            }
            
            WalkHeap();

            // Dispose now
            recyclerInstance->FinishDisposeObjectsNow<FinishDispose>();
        }
    }
    catch (Js::OutOfMemoryException)
    {
        printf("Error: OOM\n");
    }

    wprintf(_u("==== Test completed.\n"));
}